

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  allocator local_1b9;
  string input;
  string key;
  string hmac_sha256;
  string fingerprint;
  string time_token;
  string hmac_sha512;
  string hmac_sha512_upper;
  string hex_output;
  string sha512_output;
  string sha256_output;
  string sha1_output;
  string timed_token;
  string totp_key;
  
  std::__cxx11::string::string((string *)&input,"grape",(allocator *)&key);
  std::__cxx11::string::string((string *)&key,"12345",(allocator *)&sha1_output);
  std::__cxx11::string::string((string *)&sha1_output,"SHA1",(allocator *)&sha256_output);
  print_section(&sha1_output);
  std::__cxx11::string::~string((string *)&sha1_output);
  hmac_hash::sha1(&sha1_output,&input);
  poVar3 = std::operator<<((ostream *)&std::cout,"sha1(\'");
  poVar3 = std::operator<<(poVar3,(string *)&input);
  poVar3 = std::operator<<(poVar3,"\') = ");
  poVar3 = std::operator<<(poVar3,(string *)&sha1_output);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"Expected: bc8a2f8cdedb005b5c787692853709b060db75ff\n\n");
  std::__cxx11::string::string((string *)&sha256_output,"SHA256",(allocator *)&sha512_output);
  print_section(&sha256_output);
  std::__cxx11::string::~string((string *)&sha256_output);
  hmac_hash::sha256(&sha256_output,&input);
  poVar3 = std::operator<<((ostream *)&std::cout,"sha256(\'");
  poVar3 = std::operator<<(poVar3,(string *)&input);
  poVar3 = std::operator<<(poVar3,"\') = ");
  poVar3 = std::operator<<(poVar3,(string *)&sha256_output);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,
                  "Expected: 0f78fcc486f5315418fbf095e71c0675ee07d318e5ac4d150050cd8e57966496\n\n");
  std::__cxx11::string::string((string *)&sha512_output,"SHA512",(allocator *)&hex_output);
  print_section(&sha512_output);
  std::__cxx11::string::~string((string *)&sha512_output);
  hmac_hash::sha512(&sha512_output,&input);
  poVar3 = std::operator<<((ostream *)&std::cout,"sha512(\'");
  poVar3 = std::operator<<(poVar3,(string *)&input);
  poVar3 = std::operator<<(poVar3,"\') = ");
  poVar3 = std::operator<<(poVar3,(string *)&sha512_output);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,
                  "Expected: 9375d1abdb644a01955bccad12e2f5c2bd8a3e226187e548d99c559a99461453b980123746753d07c169c22a5d9cc75cb158f0e8d8c0e713559775b5e1391fc4\n\n"
                 );
  std::__cxx11::string::string((string *)&hex_output,"to_hex",(allocator *)&hmac_sha256);
  print_section(&hex_output);
  std::__cxx11::string::~string((string *)&hex_output);
  std::__cxx11::string::string((string *)&hmac_sha256,"012345",(allocator *)&hmac_sha512);
  hmac::to_hex(&hex_output,&hmac_sha256,false);
  std::__cxx11::string::~string((string *)&hmac_sha256);
  poVar3 = std::operator<<((ostream *)&std::cout,"to_hex(\"012345\") = ");
  poVar3 = std::operator<<(poVar3,(string *)&hex_output);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string((string *)&hmac_sha256,"HMAC-SHA256",(allocator *)&hmac_sha512);
  print_section(&hmac_sha256);
  std::__cxx11::string::~string((string *)&hmac_sha256);
  hmac::get_hmac(&hmac_sha256,&key,&input,SHA256,true,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"HMAC(\'");
  poVar3 = std::operator<<(poVar3,(string *)&key);
  poVar3 = std::operator<<(poVar3,"\', \'");
  poVar3 = std::operator<<(poVar3,(string *)&input);
  poVar3 = std::operator<<(poVar3,"\', SHA256) = ");
  poVar3 = std::operator<<(poVar3,(string *)&hmac_sha256);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,
                  "Expected: 7632ac2e8ddedaf4b3e7ab195fefd17571c37c970e02e169195a158ef59e53ca\n\n");
  std::__cxx11::string::string((string *)&hmac_sha512,"HMAC-SHA512",(allocator *)&hmac_sha512_upper)
  ;
  print_section(&hmac_sha512);
  std::__cxx11::string::~string((string *)&hmac_sha512);
  hmac::get_hmac(&hmac_sha512,&key,&input,SHA512,true,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"HMAC(\'");
  poVar3 = std::operator<<(poVar3,(string *)&key);
  poVar3 = std::operator<<(poVar3,"\', \'");
  poVar3 = std::operator<<(poVar3,(string *)&input);
  poVar3 = std::operator<<(poVar3,"\', SHA512) = ");
  poVar3 = std::operator<<(poVar3,(string *)&hmac_sha512);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,
                  "Expected: c54ddf9647a949d0df925a1c1f8ba1c9d721a671c396fde1062a71f9f7ffae5dc10f6be15be63bb0363d051365e23f890368c54828497b9aef2eb2fc65b633e6\n\n"
                 );
  std::__cxx11::string::string
            ((string *)&hmac_sha512_upper,"HMAC-SHA512 (uppercase)",(allocator *)&time_token);
  print_section(&hmac_sha512_upper);
  std::__cxx11::string::~string((string *)&hmac_sha512_upper);
  hmac::get_hmac(&hmac_sha512_upper,&key,&input,SHA512,true,true);
  poVar3 = std::operator<<((ostream *)&std::cout,"HMAC(\'");
  poVar3 = std::operator<<(poVar3,(string *)&key);
  poVar3 = std::operator<<(poVar3,"\', \'");
  poVar3 = std::operator<<(poVar3,(string *)&input);
  poVar3 = std::operator<<(poVar3,"\', SHA512, hex=true, upper=true) = ");
  poVar3 = std::operator<<(poVar3,(string *)&hmac_sha512_upper);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string((string *)&time_token,"HMAC-TIMED TOKEN",(allocator *)&fingerprint);
  print_section(&time_token);
  std::__cxx11::string::~string((string *)&time_token);
  hmac::generate_time_token(&time_token,&key,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Time token (now) = ");
  poVar3 = std::operator<<(poVar3,(string *)&time_token);
  std::endl<char,std::char_traits<char>>(poVar3);
  bVar1 = hmac::is_token_valid(&time_token,&key,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Token valid? = ");
  pcVar4 = "NO";
  pcVar5 = "NO";
  if (bVar1) {
    pcVar5 = "YES";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string
            ((string *)&fingerprint,"HMAC-TIMED TOKEN (with fingerprint)",(allocator *)&timed_token)
  ;
  print_section(&fingerprint);
  std::__cxx11::string::~string((string *)&fingerprint);
  std::__cxx11::string::string
            ((string *)&fingerprint,"my-client-unique-id",(allocator *)&timed_token);
  hmac::generate_time_token(&timed_token,&key,&fingerprint,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Fingerprint = ");
  poVar3 = std::operator<<(poVar3,(string *)&fingerprint);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Token = ");
  poVar3 = std::operator<<(poVar3,(string *)&timed_token);
  std::endl<char,std::char_traits<char>>(poVar3);
  bVar1 = hmac::is_token_valid(&timed_token,&key,&fingerprint,0x3c,SHA256);
  poVar3 = std::operator<<((ostream *)&std::cout,"Token valid (with fingerprint)? = ");
  if (bVar1) {
    pcVar4 = "YES";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string((string *)&totp_key,"12345678901234567890",&local_1b9);
  iVar2 = hmac::get_totp_code_at(&totp_key,0x499602d2,0x1e,8,SHA1);
  poVar3 = std::operator<<((ostream *)&std::cout,"TOTP: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"Expected: 89005924\n\n");
  std::operator<<((ostream *)&std::cout,"\nPress Enter to exit...");
  std::istream::get();
  std::__cxx11::string::~string((string *)&totp_key);
  std::__cxx11::string::~string((string *)&timed_token);
  std::__cxx11::string::~string((string *)&fingerprint);
  std::__cxx11::string::~string((string *)&time_token);
  std::__cxx11::string::~string((string *)&hmac_sha512_upper);
  std::__cxx11::string::~string((string *)&hmac_sha512);
  std::__cxx11::string::~string((string *)&hmac_sha256);
  std::__cxx11::string::~string((string *)&hex_output);
  std::__cxx11::string::~string((string *)&sha512_output);
  std::__cxx11::string::~string((string *)&sha256_output);
  std::__cxx11::string::~string((string *)&sha1_output);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&input);
  return 0;
}

Assistant:

int main() {
    const std::string input = "grape";
    const std::string key = "12345";
    
    // SHA1
    print_section("SHA1");
    std::string sha1_output = hmac_hash::sha1(input);
    std::cout << "sha1('" << input << "') = " << sha1_output << std::endl;
    std::cout << "Expected: bc8a2f8cdedb005b5c787692853709b060db75ff\n\n";

    // SHA256
    print_section("SHA256");
    std::string sha256_output = hmac_hash::sha256(input);
    std::cout << "sha256('" << input << "') = " << sha256_output << std::endl;
    std::cout << "Expected: 0f78fcc486f5315418fbf095e71c0675ee07d318e5ac4d150050cd8e57966496\n\n";

    // SHA512
    print_section("SHA512");
    std::string sha512_output = hmac_hash::sha512(input);
    std::cout << "sha512('" << input << "') = " << sha512_output << std::endl;
    std::cout << "Expected: 9375d1abdb644a01955bccad12e2f5c2bd8a3e226187e548d99c559a99461453b980123746753d07c169c22a5d9cc75cb158f0e8d8c0e713559775b5e1391fc4\n\n";

    // to_hex
    print_section("to_hex");
    std::string hex_output = hmac::to_hex("012345");
    std::cout << "to_hex(\"012345\") = " << hex_output << std::endl << std::endl;

    // HMAC-SHA256
    print_section("HMAC-SHA256");
    std::string hmac_sha256 = hmac::get_hmac(key, input, hmac::TypeHash::SHA256, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA256) = " << hmac_sha256 << std::endl;
    std::cout << "Expected: 7632ac2e8ddedaf4b3e7ab195fefd17571c37c970e02e169195a158ef59e53ca\n\n";

    // HMAC-SHA512
    print_section("HMAC-SHA512");
    std::string hmac_sha512 = hmac::get_hmac(key, input, hmac::TypeHash::SHA512, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA512) = " << hmac_sha512 << std::endl;
    std::cout << "Expected: c54ddf9647a949d0df925a1c1f8ba1c9d721a671c396fde1062a71f9f7ffae5dc10f6be15be63bb0363d051365e23f890368c54828497b9aef2eb2fc65b633e6\n\n";

    // HMAC-SHA512 uppercase hex
    print_section("HMAC-SHA512 (uppercase)");
    std::string hmac_sha512_upper = hmac::get_hmac(key, input, hmac::TypeHash::SHA512, true, true);
    std::cout << "HMAC('" << key << "', '" << input << "', SHA512, hex=true, upper=true) = " << hmac_sha512_upper << std::endl;

    // HMAC TIME TOKEN
    print_section("HMAC-TIMED TOKEN");
    std::string time_token = hmac::generate_time_token(key, 60);
    std::cout << "Time token (now) = " << time_token << std::endl;
    bool valid = hmac::is_token_valid(time_token, key, 60);
    std::cout << "Token valid? = " << (valid ? "YES" : "NO") << std::endl;

    // HMAC TIME TOKEN + fingerprint
    print_section("HMAC-TIMED TOKEN (with fingerprint)");
    std::string fingerprint = "my-client-unique-id";
    std::string timed_token = hmac::generate_time_token(key, fingerprint, 60);
    std::cout << "Fingerprint = " << fingerprint << std::endl;
    std::cout << "Token = " << timed_token << std::endl;
    bool valid_fp = hmac::is_token_valid(timed_token, key, fingerprint, 60);
    std::cout << "Token valid (with fingerprint)? = " << (valid_fp ? "YES" : "NO") << std::endl;

    // TOTP
    std::string totp_key = "12345678901234567890"; // raw binary string (not base32!)
    uint64_t test_time = 1234567890;
    int code = hmac::get_totp_code_at(totp_key, test_time, 30, 8, hmac::TypeHash::SHA1);
    std::cout << "TOTP: " << code << std::endl;
    std::cout << "Expected: 89005924\n\n";
    
    // Pause before exit
    std::cout << "\nPress Enter to exit...";
    std::cin.get();
    return 0;
}